

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereUsablePartialIndex(int iTab,WhereClause *pWC,Expr *pWhere)

{
  Expr *pE1;
  int iVar1;
  int iVar2;
  WhereTerm *pWVar3;
  Parse *pParse;
  
  pParse = pWC->pWInfo->pParse;
  for (; pWhere->op == 'G'; pWhere = pWhere->pRight) {
    iVar1 = whereUsablePartialIndex(iTab,pWC,pWhere->pLeft);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((pParse->db->flags & 0x400000) != 0) {
    pParse = (Parse *)0x0;
  }
  pWVar3 = pWC->a;
  iVar1 = 0;
  while( true ) {
    if (pWC->nTerm <= iVar1) {
      return 0;
    }
    pE1 = pWVar3->pExpr;
    if ((((pE1->flags & 1) == 0) || (pE1->iRightJoinTable == iTab)) &&
       (iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pWhere,iTab), iVar2 != 0)) break;
    iVar1 = iVar1 + 1;
    pWVar3 = pWVar3 + 1;
  }
  return 1;
}

Assistant:

static int whereUsablePartialIndex(int iTab, WhereClause *pWC, Expr *pWhere){
  int i;
  WhereTerm *pTerm;
  Parse *pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_FromJoin) || pExpr->iRightJoinTable==iTab)
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab) 
    ){
      return 1;
    }
  }
  return 0;
}